

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

NonMaximumSuppression * __thiscall
CoreML::Specification::Model::mutable_nonmaximumsuppression(Model *this)

{
  NonMaximumSuppression *this_00;
  
  if (this->_oneof_case_[0] == 0x262) {
    this_00 = (NonMaximumSuppression *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x262;
    this_00 = (NonMaximumSuppression *)operator_new(0x70);
    NonMaximumSuppression::NonMaximumSuppression(this_00);
    (this->Type_).nonmaximumsuppression_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::NonMaximumSuppression* Model::mutable_nonmaximumsuppression() {
  if (!has_nonmaximumsuppression()) {
    clear_Type();
    set_has_nonmaximumsuppression();
    Type_.nonmaximumsuppression_ = new ::CoreML::Specification::NonMaximumSuppression;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.nonMaximumSuppression)
  return Type_.nonmaximumsuppression_;
}